

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_mapping_epilog(fy_emitter *emit,fy_emit_save_ctx *sc)

{
  _Bool _Var1;
  fy_emit_save_ctx *sc_local;
  fy_emitter *emit_local;
  
  if (((*(byte *)sc >> 1 & 1) != 0) || (_Var1 = fy_emit_is_json_mode(emit), _Var1)) {
    _Var1 = fy_emit_is_oneline(emit);
    if ((!_Var1) && ((*(byte *)sc >> 2 & 1) == 0)) {
      fy_emit_write_indent(emit,sc->old_indent);
    }
    fy_emit_write_indicator(emit,di_right_brace,sc->flags,sc->old_indent,fyewt_indicator);
  }
  return;
}

Assistant:

static void fy_emit_mapping_epilog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc) {
    if (sc->flow || fy_emit_is_json_mode(emit)) {
        if (!fy_emit_is_oneline(emit) && !sc->empty)
            fy_emit_write_indent(emit, sc->old_indent);
        fy_emit_write_indicator(emit, di_right_brace, sc->flags, sc->old_indent, fyewt_indicator);
    }
}